

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConditionalExpressionSyntax *pCVar1;
  Token TVar2;
  Token *unaff_retaddr;
  ConditionalPredicateSyntax *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  ExpressionSyntax *in_stack_00000020;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_4;
  ExpressionSyntax *args_3;
  
  args_3 = (ExpressionSyntax *)__child_stack;
  not_null<slang::syntax::ConditionalPredicateSyntax_*>::operator*
            ((not_null<slang::syntax::ConditionalPredicateSyntax_*> *)0xa2f516);
  deepClone<slang::syntax::ConditionalPredicateSyntax>
            ((ConditionalPredicateSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  args_4 = (Token *)TVar2.info;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa2f56b);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa2f5ab);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalExpressionSyntax,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,args_3,args_4,
                      in_stack_00000020);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalExpressionSyntax>(
        *deepClone<ConditionalPredicateSyntax>(*node.predicate, alloc),
        node.question.deepClone(alloc),
        *deepClone(node.attributes, alloc),
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.colon.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.right, alloc)
    );
}